

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GridDataType1.cpp
# Opt level: O0

void __thiscall KDIS::DATA_TYPE::GridDataType1::GridDataType1(GridDataType1 *this)

{
  GridDataType1 *this_local;
  
  GridData::GridData(&this->super_GridData);
  (this->super_GridData).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__GridDataType1_0032e568;
  *(undefined4 *)&(this->super_GridData).field_0xc = 0;
  this->m_f32FieldOffset = 0.0;
  this->m_ui16NumValues = 0;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector(&this->m_vui16Values);
  this->m_ui16Padding = 0;
  (this->super_GridData).m_ui16DtRep = 1;
  return;
}

Assistant:

GridDataType1::GridDataType1() :
    m_f32FieldScale( 0 ),
    m_f32FieldOffset( 0 ),
    m_ui16NumValues( 0 ),
    m_ui16Padding( 0 )
{
    m_ui16DtRep = Type1;
}